

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfLogicCofVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  byte bVar1;
  Vec_Mem_t *pVVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong *puVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  word *pwVar10;
  int iVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint uVar12;
  word *pLimit;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  word *pwVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  uint iVar;
  int iLitCofs [3];
  int pVarsNew [16];
  word pTruthCof [128];
  uint local_4ec [3];
  Vec_Int_t *local_4e0;
  long local_4d8;
  long local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  word *local_4b0;
  ulong local_4a8;
  ulong *local_4a0;
  ulong *local_498;
  long local_490;
  word *local_488;
  ulong local_480;
  int aiStack_478 [16];
  word local_438 [129];
  
  uVar21 = pCutBest->iCutFunc;
  local_4e0 = vCover;
  if ((int)uVar21 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                  ,0x1ab,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  local_498 = pIfMan->puTempW;
  pVVar2 = pIfMan->vTtMem[(byte)pCutBest->field_0x1f];
  if (pVVar2 == (Vec_Mem_t *)0x0) {
    pwVar10 = (word *)0x0;
  }
  else {
    uVar12 = uVar21 >> 1;
    if (pVVar2->nEntries <= (int)uVar12) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar10 = pVVar2->ppPages[uVar12 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
              (ulong)(uVar12 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
  }
  uVar12 = pIfMan->nTruth6Words[(byte)pCutBest->field_0x1f];
  if ((uVar21 & 1) == 0) {
    if (0 < (int)uVar12) {
      uVar16 = 0;
      do {
        local_498[uVar16] = pwVar10[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
    }
  }
  else if (0 < (int)uVar12) {
    uVar16 = 0;
    do {
      local_498[uVar16] = ~pwVar10[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
  }
  uVar12 = *(uint *)&pCutBest->field_0x1c;
  uVar19 = uVar12 >> 0x18;
  uVar20 = 1 << ((char)(uVar12 >> 0x18) - 6U & 0x1f);
  if (uVar12 < 0x7000000) {
    uVar20 = 1;
  }
  if (pIfMan->vTtVars[uVar19]->nSize <= (int)(uVar21 >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  bVar1 = pIfMan->vTtVars[uVar19]->pArray[uVar21 >> 1];
  uVar21 = (uint)(char)bVar1;
  local_4b8 = (ulong)uVar21;
  if ((((int)uVar21 < 0) || ((int)uVar19 <= (int)uVar21)) || (0xd < pIfMan->pPars->nLutSize)) {
    __assert_fail("iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x650,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_4a0 = local_498 + (int)uVar20;
  iVar13 = uVar21 - 6;
  uVar14 = 1 << ((byte)iVar13 & 0x1f);
  uVar16 = 1;
  if (1 < (int)uVar14) {
    uVar16 = (ulong)uVar14;
  }
  local_4c8 = (ulong)uVar20;
  local_4a8 = (ulong)uVar19;
  lVar22 = (long)(2 << ((byte)iVar13 & 0x1f)) << 3;
  local_4b0 = local_438 + (int)uVar14;
  local_490 = (long)(int)uVar14 << 3;
  lVar23 = 0;
  local_4d8 = lVar22;
  do {
    if (0xffffff < uVar12) {
      uVar5 = 0;
      do {
        aiStack_478[uVar5] = (int)uVar5;
        uVar5 = uVar5 + 1;
      } while (local_4a8 != uVar5);
    }
    bVar7 = (byte)(1 << (bVar1 & 0x1f));
    if (lVar23 == 0) {
      if (uVar20 == 1) {
        uVar5 = s_Truths6Neg[(int)uVar21] & *local_498;
        uVar15 = uVar5 << (bVar7 & 0x3f);
        goto LAB_006ee589;
      }
      if ((char)bVar1 < '\x06') {
        if (0 < (int)uVar20) {
          uVar5 = s_Truths6Neg[(int)uVar21];
          uVar15 = 0;
          do {
            local_438[uVar15] =
                 (local_498[uVar15] & uVar5) << (bVar7 & 0x3f) | local_498[uVar15] & uVar5;
            uVar15 = uVar15 + 1;
          } while (local_4c8 != uVar15);
        }
      }
      else if (0 < (int)uVar20) {
        pwVar10 = local_438;
        puVar6 = local_498;
        pwVar18 = local_4b0;
        do {
          if (iVar13 != 0x1f) {
            uVar5 = 0;
            do {
              pwVar10[uVar5] = puVar6[uVar5];
              pwVar18[uVar5] = puVar6[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar16 != uVar5);
          }
          puVar6 = (ulong *)((long)puVar6 + lVar22);
          pwVar18 = (word *)((long)pwVar18 + lVar22);
          pwVar10 = (word *)((long)pwVar10 + lVar22);
        } while (puVar6 < local_4a0);
      }
    }
    else if (uVar20 == 1) {
      uVar5 = Gia_ManFromIfLogicNode::Truth6[(int)uVar21] & *local_498;
      uVar15 = uVar5 >> (bVar7 & 0x3f);
LAB_006ee589:
      local_438[0] = uVar15 | uVar5;
    }
    else if ((char)bVar1 < '\x06') {
      if (0 < (int)uVar20) {
        uVar5 = Gia_ManFromIfLogicNode::Truth6[(int)uVar21];
        uVar15 = 0;
        do {
          local_438[uVar15] =
               (local_498[uVar15] & uVar5) >> (bVar7 & 0x3f) | local_498[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (local_4c8 != uVar15);
      }
    }
    else if (0 < (int)uVar20) {
      pwVar10 = local_438;
      puVar6 = local_498;
      do {
        if (iVar13 != 0x1f) {
          uVar5 = 0;
          do {
            pwVar10[uVar5] = *(word *)((long)puVar6 + uVar5 * 8 + local_490);
            *(undefined8 *)((long)pwVar10 + uVar5 * 8 + local_490) =
                 *(undefined8 *)((long)puVar6 + uVar5 * 8 + local_490);
            uVar5 = uVar5 + 1;
          } while (uVar16 != uVar5);
        }
        puVar6 = (ulong *)((long)puVar6 + lVar22);
        pwVar10 = (word *)((long)pwVar10 + lVar22);
      } while (puVar6 < local_4a0);
    }
    uVar19 = *(uint *)&pCutBest->field_0x1c;
    uVar14 = uVar19 >> 0x18;
    local_4c0 = 6;
    if (6 < uVar14) {
      local_4c0 = (ulong)uVar14;
    }
    iVar = 0;
    local_4d0 = lVar23;
    if (0xffffff < uVar19) {
      iVar8 = (int)local_4c0 + -6;
      uVar3 = 1 << ((byte)iVar8 & 0x1f);
      local_488 = local_438 + (int)uVar3;
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
      uVar5 = 0;
      iVar = 0;
      local_480 = local_4c0;
      do {
        if (uVar5 == local_480) {
          __assert_fail("iVar < nVars",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                        ,0x402,"int Abc_TtHasVar(word *, int, int)");
        }
        if (uVar19 < 0x7000000) {
          if ((s_Truths6Neg[uVar5] &
              (local_438[0] >> ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f) ^ local_438[0])) != 0) {
LAB_006ee7e3:
            if ((long)(int)iVar < (long)uVar5) {
              aiStack_478[(int)iVar] = aiStack_478[uVar5];
              Abc_TtSwapVars(local_438,(int)local_4c0,iVar,(int)uVar5);
            }
            iVar = iVar + 1;
          }
        }
        else if (uVar5 < 6) {
          if (iVar8 != 0x1f) {
            uVar15 = 0;
            do {
              if (((local_438[uVar15] >> ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f) ^
                   local_438[uVar15]) & s_Truths6Neg[uVar5]) != 0) goto LAB_006ee7e3;
              uVar15 = uVar15 + 1;
            } while (uVar3 != uVar15);
          }
        }
        else if (iVar8 != 0x1f) {
          bVar7 = (byte)(uVar5 - 6);
          uVar4 = 1 << (bVar7 & 0x1f);
          iVar11 = 2 << (bVar7 & 0x1f);
          uVar15 = 1;
          if (1 < (int)uVar4) {
            uVar15 = (ulong)uVar4;
          }
          pwVar18 = local_438 + (int)uVar4;
          pwVar10 = local_438;
          do {
            if (uVar5 - 6 != 0x1f) {
              uVar17 = 0;
              do {
                if (pwVar10[uVar17] != pwVar18[uVar17]) goto LAB_006ee7e3;
                uVar17 = uVar17 + 1;
              } while (uVar15 != uVar17);
            }
            pwVar10 = pwVar10 + iVar11;
            pwVar18 = pwVar18 + iVar11;
          } while (pwVar10 < local_488);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar14);
    }
    if ((int)uVar14 < (int)iVar) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                    ,0x5c4,"int Abc_TtMinBase(word *, int *, int, int)");
    }
    vLeaves2->nSize = 0;
    if (0 < (int)iVar) {
      uVar5 = 0;
      do {
        iVar8 = aiStack_478[uVar5];
        if (((long)iVar8 < 0) || (vLeaves->nSize <= iVar8)) goto LAB_006eec6a;
        Vec_IntPush(vLeaves2,vLeaves->pArray[iVar8]);
        uVar5 = uVar5 + 1;
      } while (iVar != uVar5);
    }
    uVar19 = Kit_TruthToGia(pNew,(uint *)local_438,iVar,local_4e0,vLeaves2,0);
    lVar9 = local_4d0;
    local_4ec[local_4d0] = uVar19;
    lVar22 = local_4d8;
    if (1 < (int)iVar) {
      if ((int)uVar19 < 0) goto LAB_006eeca8;
      uVar19 = uVar19 >> 1;
      if (pNew->nObjs <= (int)uVar19) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar14 = (uint)*(undefined8 *)(pNew->pObjs + uVar19);
      if (((int)uVar14 < 0) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x662,
                      "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar8 = vMapping2->nSize;
      Vec_IntFillExtra(vMapping,uVar19 + 1,(int)pCutBest);
      if (vMapping->nSize <= (int)uVar19) goto LAB_006eece6;
      vMapping->pArray[uVar19] = iVar8;
      Vec_IntPush(vMapping2,vLeaves2->nSize);
      lVar22 = local_4d8;
      if (0 < vLeaves2->nSize) {
        lVar23 = 0;
        do {
          if (vLeaves2->pArray[lVar23] < 0) goto LAB_006eeca8;
          Vec_IntPush(vMapping2,(uint)vLeaves2->pArray[lVar23] >> 1);
          lVar23 = lVar23 + 1;
        } while (lVar23 < vLeaves2->nSize);
      }
      Vec_IntPush(vMapping2,uVar19);
      lVar9 = local_4d0;
    }
    lVar23 = lVar9 + 1;
  } while (lVar9 == 0);
  if (((char)bVar1 < '\0') || (vLeaves->nSize <= (int)local_4b8)) {
LAB_006eec6a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar21 = vLeaves->pArray[local_4b8 & 0xffffffff];
  local_4ec[2] = uVar21;
  if (1 < (int)local_4ec[1] && 1 < (int)local_4ec[0]) {
    local_438[0] = 0xcacacacacacacaca;
    vLeaves2->nSize = 0;
    Vec_IntPush(vLeaves2,local_4ec[0]);
    Vec_IntPush(vLeaves2,local_4ec[1]);
    Vec_IntPush(vLeaves2,uVar21);
    uVar21 = Kit_TruthToGia(pNew,(uint *)local_438,vLeaves2->nSize,local_4e0,vLeaves2,0);
    uVar12 = uVar21;
    iVar13 = extraout_EDX;
    goto LAB_006eeba7;
  }
  if ((int)local_4ec[0] < 2 && (int)local_4ec[1] < 2) {
    __assert_fail("iLitCofs[0] > 1 || iLitCofs[1] > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x677,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  vLeaves2->nSize = 0;
  lVar23 = 0;
  do {
    if (1 < (int)local_4ec[lVar23]) {
      Vec_IntPush(vLeaves2,local_4ec[lVar23]);
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  if (vLeaves2->nSize != 2) {
    __assert_fail("Vec_IntSize(vLeaves2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x67d,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (local_4ec[0] == 1) {
    if (((int)uVar21 < 0) || (uVar12 = uVar21, local_4ec[0] = local_4ec[1], (int)local_4ec[1] < 0))
    goto LAB_006eeda0;
LAB_006eeb95:
    uVar12 = Gia_ManAppendAnd(pNew,uVar12,local_4ec[0] ^ 1);
    if ((int)uVar12 < 0) {
LAB_006eeda0:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf4,"int Abc_LitNot(int)");
    }
    uVar12 = uVar12 ^ 1;
    iVar13 = extraout_EDX_01;
  }
  else {
    uVar12 = uVar21;
    if (local_4ec[0] != 0) {
      if (local_4ec[1] == 1) {
        if (((int)uVar21 < 0) || ((int)local_4ec[0] < 0)) goto LAB_006eeda0;
        uVar12 = uVar21 ^ 1;
        goto LAB_006eeb95;
      }
      if (local_4ec[1] != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x687,
                      "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if ((int)uVar21 < 0) goto LAB_006eeda0;
      uVar12 = uVar21 ^ 1;
      local_4ec[1] = local_4ec[0];
    }
    uVar12 = Gia_ManAppendAnd(pNew,uVar12,local_4ec[1]);
    iVar13 = extraout_EDX_00;
  }
LAB_006eeba7:
  if (-1 < (int)uVar12) {
    uVar19 = uVar12 >> 1;
    iVar8 = vMapping2->nSize;
    Vec_IntFillExtra(vMapping,uVar19 + 1,iVar13);
    if (vMapping->nSize <= (int)uVar19) {
LAB_006eece6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    vMapping->pArray[uVar19] = iVar8;
    Vec_IntPush(vMapping2,vLeaves2->nSize);
    if (0 < vLeaves2->nSize) {
      lVar23 = 0;
      do {
        if (vLeaves2->pArray[lVar23] < 0) goto LAB_006eeca8;
        Vec_IntPush(vMapping2,(uint)vLeaves2->pArray[lVar23] >> 1);
        lVar23 = lVar23 + 1;
      } while (lVar23 < vLeaves2->nSize);
    }
    if (-1 < (int)uVar21) {
      Vec_IntPush(vMapping2,-(uVar21 >> 1));
      return *(uint *)&pCutBest->field_0x1c >> 0xc & 1 ^ uVar12;
    }
  }
LAB_006eeca8:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Gia_ManFromIfLogicCofVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pTruthCof[128], * pTruth = If_CutTruthW(pIfMan, pCutBest);
    int pVarsNew[16], nVarsNew, iLitCofs[3]; 
    int nLeaves = pCutBest->nLeaves;
    int nWords  = Abc_Truth6WordNum(nLeaves);
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, iVar = Vec_StrEntry(pIfMan->vTtVars[nLeaves], truthId), iTemp, iTopLit;
    int k, RetValue = -1;
    assert( iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13 );
    for ( c = 0; c < 2; c++ )
    {
        for ( k = 0; k < nLeaves; k++ )
            pVarsNew[k] = k;
        if ( c )
            Abc_TtCofactor1p( pTruthCof, pTruth, nWords, iVar );
        else
            Abc_TtCofactor0p( pTruthCof, pTruth, nWords, iVar );
        nVarsNew = Abc_TtMinBase( pTruthCof, pVarsNew, pCutBest->nLeaves, Abc_MaxInt(6, pCutBest->nLeaves) );
        // derive LUT
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nVarsNew; k++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, pVarsNew[k]) );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, nVarsNew, vCover, vLeaves2, 0 );
        if ( nVarsNew < 2 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[2]  = Vec_IntEntry(vLeaves, iVar);
    // derive MUX
    if ( iLitCofs[0] > 1 && iLitCofs[1] > 1 )
    {
        pTruthCof[0] = ABC_CONST(0xCACACACACACACACA);
        Vec_IntClear( vLeaves2 );
        Vec_IntPush( vLeaves2, iLitCofs[0] );
        Vec_IntPush( vLeaves2, iLitCofs[1] );
        Vec_IntPush( vLeaves2, iLitCofs[2] );
        RetValue = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        iTopLit = RetValue;
    }
    else
    {
        assert( iLitCofs[0] > 1 || iLitCofs[1] > 1 );
        // collect leaves
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < 3; k++ )
            if ( iLitCofs[k] > 1 )
                Vec_IntPush( vLeaves2, iLitCofs[k] );
        assert( Vec_IntSize(vLeaves2) == 2 );
        // consider three possibilities
        if ( iLitCofs[0] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, iLitCofs[2], iLitCofs[1] );
        else if ( iLitCofs[0] == 1 )
            RetValue = Gia_ManAppendOr( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[1] );
        else if ( iLitCofs[1] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[0] );
        else if ( iLitCofs[1] == 1 )
            RetValue = Gia_ManAppendOr( pNew, iLitCofs[2], iLitCofs[0] );
        else assert( 0 );
        iTopLit = iLitCofs[2];
    }
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
    Vec_IntForEachEntry( vLeaves2, iTemp, k )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(iTopLit) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}